

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

void free_api_doc(void)

{
  xmlFreeDoc(api_doc);
  api_doc = (xmlDocPtr)0x0;
  api_dtd = (xmlDtdPtr)0x0;
  api_root = (xmlNodePtr)0x0;
  api_attr = (xmlAttrPtr)0x0;
  api_ns = (xmlNsPtr)0x0;
  return;
}

Assistant:

static void
free_api_doc(void) {
    xmlFreeDoc(api_doc);
    api_doc = NULL;
    api_dtd = NULL;
    api_root = NULL;
    api_attr = NULL;
    api_ns = NULL;
}